

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O2

void bifnob(bifcxdef *ctx,int argc)

{
  runcxdef *prVar1;
  runsdef *prVar2;
  voccxdef *voc;
  vocidef *v;
  int iVar3;
  errcxdef *peVar4;
  vocidef ***pppvVar5;
  objnum cls;
  uint uVar6;
  ulong uVar7;
  vocidef **ppvVar8;
  vocidef **ppvVar9;
  ushort obj;
  runcxdef *local_48;
  
  prVar1 = ctx->bifcxrun;
  prVar2 = prVar1->runcxsp;
  voc = prVar1->runcxvoc;
  prVar1->runcxsp = prVar2 + -1;
  local_48 = ctx->bifcxrun;
  if (prVar2[-1].runstyp != '\x02') {
    peVar4 = local_48->runcxerr;
LAB_00123746:
    peVar4->errcxptr->erraac = 0;
    runsign(ctx->bifcxrun,0x3f2);
  }
  prVar2 = local_48->runcxsp;
  obj = (prVar2->runsv).runsvobj;
  cls = 0xffff;
  if (argc != 1) {
    if (argc != 2) {
      local_48->runcxerr->errcxptr->erraac = 0;
      runsign(ctx->bifcxrun,0x401);
    }
    local_48->runcxsp = prVar2 + -1;
    local_48 = ctx->bifcxrun;
    if (prVar2[-1].runstyp != '\x02') {
      peVar4 = local_48->runcxerr;
      goto LAB_00123746;
    }
    cls = (local_48->runcxsp->runsv).runsvobj;
  }
  uVar6 = obj & 0xff;
  uVar7 = (ulong)(obj >> 8);
  pppvVar5 = voc->voccxinh + uVar7;
  ppvVar8 = (vocidef **)((ulong)(uVar6 * 8) + (long)*pppvVar5);
LAB_0012368b:
  do {
    uVar6 = uVar6 + 1;
    ppvVar8 = ppvVar8 + 1;
    ppvVar9 = ppvVar8;
    if (uVar6 == 0x100) {
      uVar7 = (ulong)((int)uVar7 + 1);
      ppvVar9 = pppvVar5[1];
      pppvVar5 = pppvVar5 + 1;
      uVar6 = 0;
      if (ppvVar9 == (vocidef **)0x0) {
        obj = obj + 0x100;
        uVar6 = 0xff;
        goto LAB_0012368b;
      }
    }
    if (0x7f < (int)uVar7) {
      runpnil(local_48);
      return;
    }
    obj = obj + 1;
    v = *ppvVar9;
    ppvVar8 = ppvVar9;
    if (((v != (vocidef *)0x0) && (((v->vociu).vocius.vociusflg & 1) == 0)) &&
       ((cls == 0xffff || (iVar3 = bifinh(voc,v,cls), iVar3 != 0)))) {
      runpobj(local_48,obj);
      return;
    }
  } while( true );
}

Assistant:

void bifnob(bifcxdef *ctx, int argc)
{
    objnum     prv;
    vocidef ***vpg;
    vocidef  **v;
    objnum     obj;
    int        i;
    int        j;
    objnum     cls;
    voccxdef  *voc = ctx->bifcxrun->runcxvoc;

    /* get last position in search */
    prv = runpopobj(ctx->bifcxrun);
    
    /* get class to search for, if one is specified */
    if (argc == 1)
        cls = MCMONINV;
    else if (argc == 2)
        cls = runpopobj(ctx->bifcxrun);
    else
        runsig(ctx->bifcxrun, ERR_BIFARGC);
    
    /* start at previous object plus 1 */
    i = (prv >> 8);
    vpg = voc->voccxinh + i;
    j = (prv & 255);
    obj = prv;
    v = (*vpg) + j;
    
    for (;;)
    {
        ++j;
        ++obj;
        ++v;
        if (j == 256)
        {
            j = 0;
            ++i;
            ++vpg;
            if (!*vpg)
            {
                obj += 255;
                j += 255;
                continue;
            }
            v = (*vpg);
        }
        if (i >= VOCINHMAX)
        {
            runpnil(ctx->bifcxrun);
            return;
        }
        
        if (!*v || ((*v)->vociflg & VOCIFCLASS)
            || (cls != MCMONINV && !bifinh(voc, *v, cls)))
            continue;
            
        /* this is an object we can use - push it */
        runpobj(ctx->bifcxrun, obj);
        return;
    }
}